

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

void ImGui::TabBarQueueReorder(ImGuiTabBar *tab_bar,ImGuiTabItem *tab,int offset)

{
  if (offset == 0) {
    __assert_fail("offset != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                  ,0x1e01,"void ImGui::TabBarQueueReorder(ImGuiTabBar *, const ImGuiTabItem *, int)"
                 );
  }
  if (tab_bar->ReorderRequestTabId == 0) {
    tab_bar->ReorderRequestTabId = tab->ID;
    tab_bar->ReorderRequestOffset = (ImS16)offset;
    return;
  }
  __assert_fail("tab_bar->ReorderRequestTabId == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_widgets.cpp"
                ,0x1e02,"void ImGui::TabBarQueueReorder(ImGuiTabBar *, const ImGuiTabItem *, int)");
}

Assistant:

void ImGui::TabBarQueueReorder(ImGuiTabBar* tab_bar, const ImGuiTabItem* tab, int offset)
{
    IM_ASSERT(offset != 0);
    IM_ASSERT(tab_bar->ReorderRequestTabId == 0);
    tab_bar->ReorderRequestTabId = tab->ID;
    tab_bar->ReorderRequestOffset = (ImS16)offset;
}